

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_client.hpp
# Opt level: O0

void __thiscall shine::http::client_base::client_base(client_base *this)

{
  client_base *this_local;
  
  this->_vptr_client_base = (_func_int **)&PTR__client_base_00308ea8;
  this->_socket_fd = -1;
  this->_sync_mode = false;
  this->_recv_timeout = 3000;
  this->_decode_step = '\0';
  shine::string::string(&this->_buf);
  this->_buf_pos = 0;
  std::function<void_(bool,_const_shine::http::request_&,_shine::http::response_&)>::function
            (&this->_response_handle);
  request::request(&this->_request);
  response::response(&this->_response);
  return;
}

Assistant:

virtual ~client_base(){

            }